

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::has_element(raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *this,value_type *elem,size_t hashval)

{
  char *pcVar1;
  slot_type *psVar2;
  int iVar3;
  ctrl_t *pcVar4;
  ulong uVar5;
  slot_type *psVar6;
  pointer __s2;
  size_t sVar7;
  size_t __n;
  uint uVar8;
  ushort uVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  int iVar26;
  uint uVar27;
  byte bVar28;
  byte unaff_BPL;
  ulong uVar29;
  bool bVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  __m128i match;
  ulong local_80;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  
  pcVar4 = this->ctrl_;
  if (pcVar4 == (ctrl_t *)0x0) {
    unaff_BPL = 0;
  }
  else {
    uVar5 = this->capacity_;
    if ((uVar5 + 1 & uVar5) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    uVar29 = hashval >> 7 & uVar5;
    auVar32 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar32 = pshuflw(auVar32,auVar32,0);
    psVar6 = this->slots_;
    __s2 = (elem->first)._M_dataplus._M_p;
    sVar7 = (elem->first)._M_string_length;
    iVar3 = elem->second;
    local_80 = 0;
    do {
      pcVar1 = pcVar4 + uVar29;
      cVar10 = *pcVar1;
      cVar11 = pcVar1[1];
      cVar12 = pcVar1[2];
      cVar13 = pcVar1[3];
      cVar14 = pcVar1[4];
      cVar15 = pcVar1[5];
      cVar16 = pcVar1[6];
      cVar17 = pcVar1[7];
      cVar18 = pcVar1[8];
      cVar19 = pcVar1[9];
      cVar20 = pcVar1[10];
      cVar21 = pcVar1[0xb];
      cVar22 = pcVar1[0xc];
      cVar23 = pcVar1[0xd];
      cVar24 = pcVar1[0xe];
      cVar25 = pcVar1[0xf];
      local_58 = auVar32[0];
      cStack_57 = auVar32[1];
      cStack_56 = auVar32[2];
      cStack_55 = auVar32[3];
      auVar33[0] = -(local_58 == cVar10);
      auVar33[1] = -(cStack_57 == cVar11);
      auVar33[2] = -(cStack_56 == cVar12);
      auVar33[3] = -(cStack_55 == cVar13);
      auVar33[4] = -(local_58 == cVar14);
      auVar33[5] = -(cStack_57 == cVar15);
      auVar33[6] = -(cStack_56 == cVar16);
      auVar33[7] = -(cStack_55 == cVar17);
      auVar33[8] = -(local_58 == cVar18);
      auVar33[9] = -(cStack_57 == cVar19);
      auVar33[10] = -(cStack_56 == cVar20);
      auVar33[0xb] = -(cStack_55 == cVar21);
      auVar33[0xc] = -(local_58 == cVar22);
      auVar33[0xd] = -(cStack_57 == cVar23);
      auVar33[0xe] = -(cStack_56 == cVar24);
      auVar33[0xf] = -(cStack_55 == cVar25);
      uVar9 = (ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe | (ushort)(auVar33[0xf] >> 7) << 0xf;
      bVar30 = uVar9 == 0;
      if (!bVar30) {
        uVar27 = (uint)uVar9;
        do {
          uVar8 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
            }
          }
          psVar2 = psVar6 + (uVar8 + uVar29 & uVar5);
          __n = (psVar2->key)._M_string_length;
          if (__n == sVar7) {
            if (__n == 0) {
              bVar31 = true;
            }
            else {
              iVar26 = bcmp((psVar2->value).first._M_dataplus._M_p,__s2,__n);
              bVar31 = iVar26 == 0;
            }
          }
          else {
            bVar31 = false;
          }
          bVar28 = (psVar2->value).second == iVar3 & bVar31;
          unaff_BPL = unaff_BPL | bVar28;
          if (bVar28 != 0) break;
          uVar27 = uVar27 - 1 & uVar27;
          bVar30 = uVar27 == 0;
        } while (!bVar30);
      }
      if (bVar30) {
        auVar34[0] = -(cVar10 == -0x80);
        auVar34[1] = -(cVar11 == -0x80);
        auVar34[2] = -(cVar12 == -0x80);
        auVar34[3] = -(cVar13 == -0x80);
        auVar34[4] = -(cVar14 == -0x80);
        auVar34[5] = -(cVar15 == -0x80);
        auVar34[6] = -(cVar16 == -0x80);
        auVar34[7] = -(cVar17 == -0x80);
        auVar34[8] = -(cVar18 == -0x80);
        auVar34[9] = -(cVar19 == -0x80);
        auVar34[10] = -(cVar20 == -0x80);
        auVar34[0xb] = -(cVar21 == -0x80);
        auVar34[0xc] = -(cVar22 == -0x80);
        auVar34[0xd] = -(cVar23 == -0x80);
        auVar34[0xe] = -(cVar24 == -0x80);
        auVar34[0xf] = -(cVar25 == -0x80);
        if ((((((((((((((((auVar34 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar34 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar34 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar34 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar34 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar34 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar34 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar34 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar34 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar34 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar34 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar34 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar34[0xf]
           ) {
          if (uVar5 <= local_80 + 0x10) {
            __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                          ,0x87c,
                          "bool phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::basic_string<char>, int>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::pair<const std::basic_string<char>, int>>>::has_element(const value_type &__restrict, size_t) const [Policy = phmap::priv::FlatHashMapPolicy<std::basic_string<char>, int>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::pair<const std::basic_string<char>, int>>]"
                         );
          }
          uVar29 = uVar29 + local_80 + 0x10 & uVar5;
          bVar30 = true;
          local_80 = local_80 + 0x10;
        }
        else {
          bVar30 = false;
          unaff_BPL = 0;
        }
      }
      else {
        bVar30 = false;
      }
    } while (bVar30);
  }
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool has_element(const value_type& PHMAP_RESTRICT elem, size_t hashval) const {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return false;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::element(slots_ + seq.offset((size_t)i)) ==
                                      elem))
                    return true;
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) return false;
            seq.next();
            assert(seq.getindex() < capacity_ && "full table!");
        }
        return false;
    }